

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_makefuncs.cpp
# Opt level: O0

PGRangeVar * duckdb_libpgquery::makeRangeVar(char *schemaname,char *relname,int location)

{
  PGRangeVar *pPVar1;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  PGRangeVar *r;
  PGNodeTag in_stack_ffffffffffffffdc;
  size_t in_stack_ffffffffffffffe0;
  
  pPVar1 = (PGRangeVar *)newNode(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  pPVar1->catalogname = (char *)0x0;
  pPVar1->schemaname = in_RDI;
  pPVar1->relname = in_RSI;
  pPVar1->inh = true;
  pPVar1->relpersistence = '\x02';
  pPVar1->alias = (PGAlias *)0x0;
  pPVar1->location = in_EDX;
  pPVar1->sample = (PGNode *)0x0;
  return pPVar1;
}

Assistant:

PGRangeVar *makeRangeVar(char *schemaname, char *relname, int location) {
	PGRangeVar *r = makeNode(PGRangeVar);

	r->catalogname = NULL;
	r->schemaname = schemaname;
	r->relname = relname;
	r->inh = true;
	r->relpersistence = RELPERSISTENCE_PERMANENT;
	r->alias = NULL;
	r->location = location;
	r->sample = NULL;

	return r;
}